

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O3

int verify_miniscript_or_i(miniscript_node_t *node,miniscript_node_t *parent)

{
  miniscript_node_t *pmVar1;
  miniscript_node_t *pmVar2;
  uint32_t uVar3;
  int iVar4;
  int iVar5;
  
  iVar5 = 0;
  pmVar1 = node->child;
  for (pmVar2 = pmVar1; pmVar2 != (miniscript_node_t *)0x0; pmVar2 = pmVar2->next) {
    iVar5 = iVar5 + 1;
  }
  iVar4 = -2;
  if (iVar5 == node->info->inner_num) {
    uVar3 = verify_miniscript_or_i_property(pmVar1->type_properties,pmVar1->next->type_properties);
    node->type_properties = uVar3;
    iVar4 = (uint)(uVar3 != 0) * 2 + -2;
  }
  return iVar4;
}

Assistant:

static int verify_miniscript_or_i(struct miniscript_node_t *node, struct miniscript_node_t *parent)
{
    int ret = verify_miniscript_two_param_check(node, parent);
    if (ret == WALLY_OK) {
        node->type_properties = verify_miniscript_or_i_property(
            node->child->type_properties,
            node->child->next->type_properties);
        if (!node->type_properties)
            ret = WALLY_EINVAL;
    }
    return ret;
}